

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_status_code.hpp
# Opt level: O0

bool __thiscall
system_error2::detail::
indirecting_domain<system_error2::status_code<_file_io_error_domain>,_std::allocator<system_error2::status_code<_file_io_error_domain>_>_>
::_do_erased_copy(indirecting_domain<system_error2::status_code<_file_io_error_domain>,_std::allocator<system_error2::status_code<_file_io_error_domain>_>_>
                  *this,status_code<void> *dst,status_code<void> *src,payload_info_t dstinfo)

{
  bool bVar1;
  status_code_domain *this_00;
  value_type *pppVar2;
  pointer local_68;
  payload_type *dp;
  value_type ppStack_58;
  template_rebind_alloc<payload_type> payload_alloc;
  payload_type *sp;
  _mycode *_s;
  _mycode *d;
  payload_info_t srcinfo;
  status_code<void> *src_local;
  status_code<void> *dst_local;
  indirecting_domain<system_error2::status_code<_file_io_error_domain>,_std::allocator<system_error2::status_code<_file_io_error_domain>_>_>
  *this_local;
  
  srcinfo.total_alignment = (size_t)src;
  (*(this->super_status_code_domain)._vptr_status_code_domain[1])(&d);
  this_00 = status_code<void>::domain((status_code<void> *)srcinfo.total_alignment);
  bVar1 = status_code_domain::operator==(this_00,&this->super_status_code_domain);
  if (bVar1) {
    if (srcinfo.payload_size <= dstinfo.total_size) {
      pppVar2 = status_code_storage<system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>,_std::allocator<system_error2::status_code<_file_io_error_domain>_>_>_>
                ::value((status_code_storage<system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>,_std::allocator<system_error2::status_code<_file_io_error_domain>_>_>_>
                         *)srcinfo.total_alignment);
      ppStack_58 = *pppVar2;
      std::
      allocator<system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>,std::allocator<system_error2::status_code<_file_io_error_domain>>>::payload_type>
      ::allocator<system_error2::status_code<_file_io_error_domain>>
                ((allocator<system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>,std::allocator<system_error2::status_code<_file_io_error_domain>>>::payload_type>
                  *)((long)&dp + 7),
                 (allocator<system_error2::status_code<_file_io_error_domain>_> *)
                 &ppStack_58->field_0x18);
      local_68 = std::
                 allocator_traits<std::allocator<system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>,_std::allocator<system_error2::status_code<_file_io_error_domain>_>_>::payload_type>_>
                 ::allocate((allocator_type *)((long)&dp + 7),1);
      std::
      allocator_traits<std::allocator<system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>,std::allocator<system_error2::status_code<_file_io_error_domain>>>::payload_type>>
      ::
      construct<system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>,std::allocator<system_error2::status_code<_file_io_error_domain>>>::payload_type,system_error2::status_code<_file_io_error_domain>const&,std::allocator<system_error2::status_code<_file_io_error_domain>>const&>
                ((allocator_type *)((long)&dp + 7),local_68,
                 (status_code<_file_io_error_domain> *)ppStack_58,
                 (allocator<system_error2::status_code<_file_io_error_domain>_> *)
                 &ppStack_58->field_0x18);
      status_code<system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>,std::allocator<system_error2::status_code<_file_io_error_domain>>>>
      ::
      status_code<system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>,std::allocator<system_error2::status_code<_file_io_error_domain>>>::payload_type*&>
                ((status_code<system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>,std::allocator<system_error2::status_code<_file_io_error_domain>>>>
                  *)dst,&local_68);
      std::
      allocator<system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>,_std::allocator<system_error2::status_code<_file_io_error_domain>_>_>::payload_type>
      ::~allocator((allocator<system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>,_std::allocator<system_error2::status_code<_file_io_error_domain>_>_>::payload_type>
                    *)((long)&dp + 7));
    }
    return srcinfo.payload_size <= dstinfo.total_size;
  }
  __assert_fail("src.domain() == *this",
                "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/nested_status_code.hpp"
                ,0x84,
                "virtual bool system_error2::detail::indirecting_domain<system_error2::status_code<_file_io_error_domain>, std::allocator<system_error2::status_code<_file_io_error_domain>>>::_do_erased_copy(status_code<void> &, const status_code<void> &, payload_info_t) const [StatusCode = system_error2::status_code<_file_io_error_domain>, Allocator = std::allocator<system_error2::status_code<_file_io_error_domain>>]"
               );
}

Assistant:

virtual bool _do_erased_copy(status_code<void> &dst, const status_code<void> &src, payload_info_t dstinfo) const override  // NOLINT
    {
      // Note that dst may not have its domain set
      const auto srcinfo = payload_info();
      assert(src.domain() == *this);
      if(dstinfo.total_size < srcinfo.total_size)
      {
        return false;
      }
      auto &d = static_cast<_mycode &>(dst);               // NOLINT
      const auto &_s = static_cast<const _mycode &>(src);  // NOLINT
      const payload_type &sp = *_s.value();
      typename payload_allocator_traits::template rebind_alloc<payload_type> payload_alloc(sp.alloc);
      auto *dp = payload_allocator_traits::allocate(payload_alloc, 1);
#if defined(_CPPUNWIND) || defined(__EXCEPTIONS) || defined(STANDARDESE_IS_IN_THE_HOUSE)
      try
#endif
      {
        payload_allocator_traits::construct(payload_alloc, dp, sp.sc, sp.alloc);
        new(SYSTEM_ERROR2_ADDRESS_OF(d)) _mycode(in_place, dp);
      }
#if defined(_CPPUNWIND) || defined(__EXCEPTIONS) || defined(STANDARDESE_IS_IN_THE_HOUSE)
      catch(...)
      {
        payload_allocator_traits::deallocate(payload_alloc, dp, 1);
        throw;
      }
#endif
      return true;
    }